

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<-19>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<-7>,_boost::random::detail::M3<-13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
           *this)

{
  type __n;
  type last;
  int local_b0;
  result_type local_ac;
  int iterations;
  result_type x;
  uint *p;
  uint local_98 [2];
  uint state [32];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
  *this_local;
  
  __n = boost::size<unsigned_int[32]>((uint (*) [32])local_98);
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_98,__n,(int *)((long)&p + 4));
  _iterations = local_98;
  last = boost::range_adl_barrier::end<unsigned_int[32]>((uint (*) [32])local_98);
  boost::random::
  well_engine<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,boost::random::detail::M1,boost::random::detail::M3<8>,boost::random::detail::M3<-19>,boost::random::detail::M3<-14>,boost::random::detail::M3<-11>,boost::random::detail::M3<-7>,boost::random::detail::M3<-13>,boost::random::detail::M0,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,boost::random::detail::M1,boost::random::detail::M3<8>,boost::random::detail::M3<_19>,boost::random::detail::M3<_14>,boost::random::detail::M3<_11>,boost::random::detail::M3<_7>,boost::random::detail::M3<_13>,boost::random::detail::M0,boost::random::detail::no_tempering>
              *)this,(uint **)&iterations,last);
  local_b0 = 1000000000;
  while (0 < local_b0) {
    local_ac = boost::random::
               well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<-19>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<-7>,_boost::random::detail::M3<-13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
               ::operator()(&this->rng);
    local_b0 = local_b0 + -1;
  }
  return local_ac;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }